

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.cpp
# Opt level: O1

void __thiscall
mnf::Manifold::Manifold
          (Manifold *this,Index dimension,Index tangentDimension,Index representationDimension)

{
  long lVar1;
  undefined8 uVar2;
  
  this->super_RefCounter = 0;
  this->super_ValidManifold = 0x677d7257;
  this->_vptr_Manifold = (_func_int **)&PTR__Manifold_001417c0;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  this->dimension_ = dimension;
  this->tangentDim_ = tangentDimension;
  this->representationDim_ = representationDimension;
  this->lock_ = false;
  if (((-1 < dimension) && (dimension <= tangentDimension)) &&
     (tangentDimension <= representationDimension)) {
    lVar1 = manifoldCounter_ + 1;
    this->instanceId_ = manifoldCounter_;
    manifoldCounter_ = lVar1;
    return;
  }
  uVar2 = __cxa_allocate_exception(1);
  __cxa_throw(uVar2,&mnf_exception::typeinfo,0);
}

Assistant:

Manifold::Manifold(Index dimension, Index tangentDimension,
                   Index representationDimension)
    : dimension_(dimension),
      tangentDim_(tangentDimension),
      representationDim_(representationDimension),
      lock_(false)
{
  mnf_assert(0 <= dimension && "Negative dimension not accepted");
  mnf_assert(dimension <= tangentDimension);
  mnf_assert(tangentDimension <= representationDimension);
  this->instanceId_ = manifoldCounter_++;
}